

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cborencoder.c
# Opt level: O0

CborError append_to_buffer(CborEncoder *encoder,void *data,size_t len,
                          CborEncoderAppendType appendType)

{
  CborError CVar1;
  undefined8 in_RSI;
  size_t in_RDI;
  undefined4 unaff_retaddr;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  CVar1 = CborDevice::callback
                    ((void *)CONCAT44(appendType,unaff_retaddr),
                     (void *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                     (CborEncoderAppendType)((ulong)in_RSI >> 0x20));
  return CVar1;
}

Assistant:

static inline CborError append_to_buffer(CborEncoder *encoder, const void *data, size_t len,
                                         CborEncoderAppendType appendType)
{
    if (CBOR_ENCODER_WRITER_CONTROL >= 0) {
        if (encoder->flags & CborIteratorFlag_WriterFunction || CBOR_ENCODER_WRITER_CONTROL != 0) {
#  ifdef CBOR_ENCODER_WRITE_FUNCTION
            return CBOR_ENCODER_WRITE_FUNCTION(encoder->end, data, len, appendType);
#  else
            return encoder->data.writer(encoder->end, data, len, appendType);
#  endif
        }
    }

#if CBOR_ENCODER_WRITER_CONTROL <= 0
    if (would_overflow(encoder, len)) {
        if (encoder->end != NULL) {
            len -= encoder->end - encoder->data.ptr;
            encoder->end = NULL;
            encoder->data.bytes_needed = 0;
        }

        advance_ptr(encoder, len);
        return CborErrorOutOfMemory;
    }

    memcpy(encoder->data.ptr, data, len);
    encoder->data.ptr += len;
#endif
    return CborNoError;
}